

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

StringRef llvm::sys::path::root_path(StringRef path,Style style)

{
  bool bVar1;
  char cVar2;
  char cVar3;
  Style SVar4;
  StringRef *pSVar5;
  size_t sVar6;
  reference pSVar7;
  const_iterator *this;
  size_t sVar8;
  ulong uVar9;
  Style in_R8D;
  StringRef SVar10;
  StringRef path_00;
  bool local_101;
  bool local_f9;
  StringRef local_f8;
  bool local_e2;
  bool local_e1;
  bool has_drive;
  path *ppStack_e0;
  bool has_net;
  char *local_d8;
  undefined1 local_d0 [8];
  const_iterator e;
  const_iterator pos;
  undefined1 local_60 [8];
  const_iterator b;
  undefined1 auStack_28 [4];
  Style style_local;
  StringRef path_local;
  
  path_local.Data = (char *)path.Length;
  _auStack_28 = (path *)path.Data;
  SVar10.Length._0_4_ = style;
  SVar10.Data = path_local.Data;
  SVar10.Length._4_4_ = 0;
  uVar9 = (ulong)style;
  b._44_4_ = style;
  begin((const_iterator *)local_60,_auStack_28,SVar10,in_R8D);
  memcpy(&e.S,local_60,0x30);
  ppStack_e0 = _auStack_28;
  local_d8 = path_local.Data;
  path_00.Length = uVar9;
  path_00.Data = path_local.Data;
  end((const_iterator *)local_d0,_auStack_28,path_00);
  bVar1 = iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
          ::operator!=((iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
                        *)local_60,(const_iterator *)local_d0);
  if (bVar1) {
    pSVar5 = iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
             ::operator->((iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
                           *)local_60);
    sVar6 = StringRef::size(pSVar5);
    local_f9 = false;
    if (2 < sVar6) {
      pSVar7 = const_iterator::operator*((const_iterator *)local_60);
      cVar2 = StringRef::operator[](pSVar7,0);
      bVar1 = is_separator(cVar2,b._44_4_);
      local_f9 = false;
      if (bVar1) {
        pSVar7 = const_iterator::operator*((const_iterator *)local_60);
        cVar2 = StringRef::operator[](pSVar7,1);
        pSVar7 = const_iterator::operator*((const_iterator *)local_60);
        cVar3 = StringRef::operator[](pSVar7,0);
        local_f9 = cVar2 == cVar3;
      }
    }
    local_e1 = local_f9;
    SVar4 = anon_unknown.dwarf_3697931::real_style(b._44_4_);
    local_101 = false;
    if (SVar4 == windows) {
      pSVar5 = iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
               ::operator->((iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
                             *)local_60);
      StringRef::StringRef(&local_f8,":");
      local_101 = StringRef::endswith(pSVar5,local_f8);
    }
    local_e2 = local_101;
    if (((local_e1 & 1U) != 0) || (local_101 != false)) {
      this = const_iterator::operator++((const_iterator *)&e.S);
      bVar1 = iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
              ::operator!=((iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
                            *)this,(const_iterator *)local_d0);
      if (bVar1) {
        pSVar7 = const_iterator::operator*((const_iterator *)&e.S);
        cVar2 = StringRef::operator[](pSVar7,0);
        bVar1 = is_separator(cVar2,b._44_4_);
        if (bVar1) {
          pSVar5 = iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
                   ::operator->((iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
                                 *)local_60);
          sVar6 = StringRef::size(pSVar5);
          pSVar5 = iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
                   ::operator->((iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
                                 *)&e.S);
          sVar8 = StringRef::size(pSVar5);
          SVar10 = StringRef::substr((StringRef *)auStack_28,0,sVar6 + sVar8);
          return SVar10;
        }
      }
      pSVar7 = const_iterator::operator*((const_iterator *)local_60);
      return *pSVar7;
    }
    pSVar7 = const_iterator::operator*((const_iterator *)local_60);
    cVar2 = StringRef::operator[](pSVar7,0);
    bVar1 = is_separator(cVar2,b._44_4_);
    if (bVar1) {
      pSVar7 = const_iterator::operator*((const_iterator *)local_60);
      return *pSVar7;
    }
  }
  memset(&path_local.Length,0,0x10);
  StringRef::StringRef((StringRef *)&path_local.Length);
  return stack0xffffffffffffffe8;
}

Assistant:

StringRef root_path(StringRef path, Style style) {
  const_iterator b = begin(path, style), pos = b, e = end(path);
  if (b != e) {
    bool has_net =
        b->size() > 2 && is_separator((*b)[0], style) && (*b)[1] == (*b)[0];
    bool has_drive = (real_style(style) == Style::windows) && b->endswith(":");

    if (has_net || has_drive) {
      if ((++pos != e) && is_separator((*pos)[0], style)) {
        // {C:/,//net/}, so get the first two components.
        return path.substr(0, b->size() + pos->size());
      } else {
        // just {C:,//net}, return the first component.
        return *b;
      }
    }

    // POSIX style root directory.
    if (is_separator((*b)[0], style)) {
      return *b;
    }
  }

  return StringRef();
}